

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_blob_open(sqlite3 *db,char *zDb,char *zTable,char *zColumn,sqlite_int64 iRow,int wrFlag,
                     sqlite3_blob **ppBlob)

{
  long lVar1;
  int iVar2;
  Incrblob *p;
  Vdbe *pVVar3;
  VdbeOp *pVVar4;
  char *zFormat;
  bool local_a1;
  VdbeOp *aOp;
  int iDb;
  Vdbe *v;
  int j_1;
  int j;
  FKey *pFKey;
  Index *pIdx;
  char *zFault;
  Incrblob *pBlob;
  Parse *pParse;
  Table *pTab;
  char *zErr;
  int rc;
  int iCol;
  int nAttempt;
  int wrFlag_local;
  sqlite_int64 iRow_local;
  char *zColumn_local;
  char *zTable_local;
  char *zDb_local;
  sqlite3 *db_local;
  
  rc = 0;
  zErr._0_4_ = 0;
  pTab = (Table *)0x0;
  pBlob = (Incrblob *)0x0;
  *ppBlob = (sqlite3_blob *)0x0;
  iCol = (int)(wrFlag != 0);
  _nAttempt = iRow;
  iRow_local = (sqlite_int64)zColumn;
  zColumn_local = zTable;
  zTable_local = zDb;
  zDb_local = (char *)db;
  sqlite3_mutex_enter(db->mutex);
  p = (Incrblob *)sqlite3DbMallocZero((sqlite3 *)zDb_local,0x38);
  if ((p != (Incrblob *)0x0) &&
     (pBlob = (Incrblob *)sqlite3DbMallocRaw((sqlite3 *)zDb_local,0x250),
     (Parse *)pBlob != (Parse *)0x0)) {
    do {
      memset(pBlob,0,0x250);
      ((Parse *)pBlob)->db = (sqlite3 *)zDb_local;
      sqlite3DbFree((sqlite3 *)zDb_local,pTab);
      pTab = (Table *)0x0;
      sqlite3BtreeEnterAll((sqlite3 *)zDb_local);
      pParse = (Parse *)sqlite3LocateTable((Parse *)pBlob,0,zColumn_local,zTable_local);
      if ((pParse != (Parse *)0x0) && ((pParse->iSelfTab & 0x10) != 0)) {
        pParse = (Parse *)0x0;
        sqlite3ErrorMsg((Parse *)pBlob,"cannot open virtual table: %s",zColumn_local);
      }
      if ((pParse != (Parse *)0x0) && ((pParse->iSelfTab & 0x20) != 0)) {
        pParse = (Parse *)0x0;
        sqlite3ErrorMsg((Parse *)pBlob,"cannot open table without rowid: %s",zColumn_local);
      }
      if ((pParse != (Parse *)0x0) &&
         (lVar1._0_4_ = pParse->rc, lVar1._4_1_ = pParse->colNamesSet,
         lVar1._5_1_ = pParse->checkSchema, lVar1._6_1_ = pParse->nested,
         lVar1._7_1_ = pParse->nTempReg, lVar1 != 0)) {
        pParse = (Parse *)0x0;
        sqlite3ErrorMsg((Parse *)pBlob,"cannot open view: %s",zColumn_local);
      }
      if (pParse == (Parse *)0x0) {
        if (((Parse *)pBlob)->zErrMsg != (char *)0x0) {
          sqlite3DbFree((sqlite3 *)zDb_local,pTab);
          pTab = (Table *)((Parse *)pBlob)->zErrMsg;
          ((Parse *)pBlob)->zErrMsg = (char *)0x0;
        }
        zErr._0_4_ = 1;
        sqlite3BtreeLeaveAll((sqlite3 *)zDb_local);
        break;
      }
      p->pTab = (Table *)pParse;
      lVar1 = *(long *)(zDb_local + 0x20);
      iVar2 = sqlite3SchemaToIndex((sqlite3 *)zDb_local,*(Schema **)&(pParse->constraintName).n);
      p->zDb = *(char **)(lVar1 + (long)iVar2 * 0x20);
      zErr._4_4_ = 0;
      while ((zErr._4_4_ < *(short *)((long)&pParse->szOpAlloc + 2) &&
             (iVar2 = sqlite3StrICmp(*(char **)(pParse->zErrMsg + (long)zErr._4_4_ * 0x20),
                                     (char *)iRow_local), iVar2 != 0))) {
        zErr._4_4_ = zErr._4_4_ + 1;
      }
      if (zErr._4_4_ == *(short *)((long)&pParse->szOpAlloc + 2)) {
        sqlite3DbFree((sqlite3 *)zDb_local,pTab);
        pTab = (Table *)sqlite3MPrintf((sqlite3 *)zDb_local,"no such column: \"%s\"",iRow_local);
        zErr._0_4_ = 1;
        sqlite3BtreeLeaveAll((sqlite3 *)zDb_local);
        break;
      }
      if (iCol != 0) {
        pIdx = (Index *)0x0;
        if ((*(uint *)(zDb_local + 0x2c) & 0x80000) != 0) {
          j_1._0_1_ = pParse->isMultiWrite;
          j_1._1_1_ = pParse->mayAbort;
          j_1._2_1_ = pParse->hasCompound;
          j_1._3_1_ = pParse->okConstFactor;
          unique0x00012004 = pParse->disableLookaside;
          unique0x00012005 = pParse->nColCache;
          unique0x00012006 = *(undefined2 *)&pParse->field_0x26;
          for (; _j_1 != 0; _j_1 = *(long *)(_j_1 + 8)) {
            for (v._4_4_ = 0; v._4_4_ < *(int *)(_j_1 + 0x28); v._4_4_ = v._4_4_ + 1) {
              if (*(int *)(_j_1 + 0x40 + (long)v._4_4_ * 0x10) == zErr._4_4_) {
                pIdx = (Index *)anon_var_dwarf_6b4;
              }
            }
          }
        }
        for (pFKey = (FKey *)pParse->pVdbe; pFKey != (FKey *)0x0; pFKey = *(FKey **)&pFKey->nCol) {
          for (v._0_4_ = 0; (int)v < (int)(uint)*(ushort *)((long)&pFKey[1].pNextFrom + 6);
              v._0_4_ = (int)v + 1) {
            if ((*(short *)(pFKey->pNextFrom->aAction + (long)(int)v * 2 + -0x2d) == zErr._4_4_) ||
               (*(short *)(pFKey->pNextFrom->aAction + (long)(int)v * 2 + -0x2d) == -2)) {
              pIdx = (Index *)0x1b1f28;
            }
          }
        }
        if (pIdx != (Index *)0x0) {
          sqlite3DbFree((sqlite3 *)zDb_local,pTab);
          pTab = (Table *)sqlite3MPrintf((sqlite3 *)zDb_local,"cannot open %s column for writing",
                                         pIdx);
          zErr._0_4_ = 1;
          sqlite3BtreeLeaveAll((sqlite3 *)zDb_local);
          break;
        }
      }
      pVVar3 = sqlite3VdbeCreate((Parse *)pBlob);
      p->pStmt = (sqlite3_stmt *)pVVar3;
      if (p->pStmt != (sqlite3_stmt *)0x0) {
        pVVar3 = (Vdbe *)p->pStmt;
        iVar2 = sqlite3SchemaToIndex((sqlite3 *)zDb_local,*(Schema **)&(pParse->constraintName).n);
        sqlite3VdbeAddOp4Int
                  (pVVar3,2,iVar2,iCol,**(int **)&(pParse->constraintName).n,
                   *(int *)(*(long *)&(pParse->constraintName).n + 4));
        sqlite3VdbeChangeP5(pVVar3,1);
        pVVar4 = sqlite3VdbeAddOpList(pVVar3,6,sqlite3_blob_open::openBlob,0);
        sqlite3VdbeUsesBtree(pVVar3,iVar2);
        if (zDb_local[0x55] == '\0') {
          pVVar4->p1 = iVar2;
          pVVar4->p2 = pParse->nMem;
          pVVar4->p3 = iCol;
          sqlite3VdbeChangeP4(pVVar3,1,(char *)pParse->db,0);
        }
        if (zDb_local[0x55] == '\0') {
          if (iCol != 0) {
            pVVar4[1].opcode = 'i';
          }
          pVVar4[1].p2 = pParse->nMem;
          pVVar4[1].p3 = iVar2;
          pVVar4[1].p4type = -0xb;
          pVVar4[1].p4.i = *(short *)((long)&pParse->szOpAlloc + 2) + 1;
          pVVar4[3].p2 = (int)*(short *)((long)&pParse->szOpAlloc + 2);
          ((Parse *)pBlob)->nVar = 0;
          ((Parse *)pBlob)->nMem = 1;
          ((Parse *)pBlob)->nTab = 1;
          sqlite3VdbeMakeReady(pVVar3,(Parse *)pBlob);
        }
      }
      p->iCol = (u16)zErr._4_4_;
      p->db = (sqlite3 *)zDb_local;
      sqlite3BtreeLeaveAll((sqlite3 *)zDb_local);
      if (zDb_local[0x55] != '\0') break;
      zErr._0_4_ = blobSeekToRow(p,_nAttempt,(char **)&pTab);
      rc = rc + 1;
      local_a1 = rc < 0x32 && (int)zErr == 0x11;
    } while (local_a1);
  }
  if (((int)zErr == 0) && (zDb_local[0x55] == '\0')) {
    *ppBlob = (sqlite3_blob *)p;
  }
  else {
    if ((p != (Incrblob *)0x0) && (p->pStmt != (sqlite3_stmt *)0x0)) {
      sqlite3VdbeFinalize((Vdbe *)p->pStmt);
    }
    sqlite3DbFree((sqlite3 *)zDb_local,p);
  }
  zFormat = (char *)0x0;
  if (pTab != (Table *)0x0) {
    zFormat = "%s";
  }
  sqlite3ErrorWithMsg((sqlite3 *)zDb_local,(int)zErr,zFormat,pTab);
  sqlite3DbFree((sqlite3 *)zDb_local,pTab);
  sqlite3ParserReset((Parse *)pBlob);
  sqlite3DbFree((sqlite3 *)zDb_local,pBlob);
  zErr._0_4_ = sqlite3ApiExit((sqlite3 *)zDb_local,(int)zErr);
  sqlite3_mutex_leave(*(sqlite3_mutex **)(zDb_local + 0x18));
  return (int)zErr;
}

Assistant:

SQLITE_API int sqlite3_blob_open(
  sqlite3* db,            /* The database connection */
  const char *zDb,        /* The attached database containing the blob */
  const char *zTable,     /* The table containing the blob */
  const char *zColumn,    /* The column containing the blob */
  sqlite_int64 iRow,      /* The row containing the glob */
  int wrFlag,             /* True -> read/write access, false -> read-only */
  sqlite3_blob **ppBlob   /* Handle for accessing the blob returned here */
){
  int nAttempt = 0;
  int iCol;               /* Index of zColumn in row-record */
  int rc = SQLITE_OK;
  char *zErr = 0;
  Table *pTab;
  Parse *pParse = 0;
  Incrblob *pBlob = 0;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( ppBlob==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif
  *ppBlob = 0;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) || zTable==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif
  wrFlag = !!wrFlag;                /* wrFlag = (wrFlag ? 1 : 0); */

  sqlite3_mutex_enter(db->mutex);

  pBlob = (Incrblob *)sqlite3DbMallocZero(db, sizeof(Incrblob));
  if( !pBlob ) goto blob_open_out;
  pParse = sqlite3StackAllocRaw(db, sizeof(*pParse));
  if( !pParse ) goto blob_open_out;

  do {
    memset(pParse, 0, sizeof(Parse));
    pParse->db = db;
    sqlite3DbFree(db, zErr);
    zErr = 0;

    sqlite3BtreeEnterAll(db);
    pTab = sqlite3LocateTable(pParse, 0, zTable, zDb);
    if( pTab && IsVirtual(pTab) ){
      pTab = 0;
      sqlite3ErrorMsg(pParse, "cannot open virtual table: %s", zTable);
    }
    if( pTab && !HasRowid(pTab) ){
      pTab = 0;
      sqlite3ErrorMsg(pParse, "cannot open table without rowid: %s", zTable);
    }
#ifndef SQLITE_OMIT_VIEW
    if( pTab && pTab->pSelect ){
      pTab = 0;
      sqlite3ErrorMsg(pParse, "cannot open view: %s", zTable);
    }
#endif
    if( !pTab ){
      if( pParse->zErrMsg ){
        sqlite3DbFree(db, zErr);
        zErr = pParse->zErrMsg;
        pParse->zErrMsg = 0;
      }
      rc = SQLITE_ERROR;
      sqlite3BtreeLeaveAll(db);
      goto blob_open_out;
    }
    pBlob->pTab = pTab;
    pBlob->zDb = db->aDb[sqlite3SchemaToIndex(db, pTab->pSchema)].zDbSName;

    /* Now search pTab for the exact column. */
    for(iCol=0; iCol<pTab->nCol; iCol++) {
      if( sqlite3StrICmp(pTab->aCol[iCol].zName, zColumn)==0 ){
        break;
      }
    }
    if( iCol==pTab->nCol ){
      sqlite3DbFree(db, zErr);
      zErr = sqlite3MPrintf(db, "no such column: \"%s\"", zColumn);
      rc = SQLITE_ERROR;
      sqlite3BtreeLeaveAll(db);
      goto blob_open_out;
    }

    /* If the value is being opened for writing, check that the
    ** column is not indexed, and that it is not part of a foreign key. 
    */
    if( wrFlag ){
      const char *zFault = 0;
      Index *pIdx;
#ifndef SQLITE_OMIT_FOREIGN_KEY
      if( db->flags&SQLITE_ForeignKeys ){
        /* Check that the column is not part of an FK child key definition. It
        ** is not necessary to check if it is part of a parent key, as parent
        ** key columns must be indexed. The check below will pick up this 
        ** case.  */
        FKey *pFKey;
        for(pFKey=pTab->pFKey; pFKey; pFKey=pFKey->pNextFrom){
          int j;
          for(j=0; j<pFKey->nCol; j++){
            if( pFKey->aCol[j].iFrom==iCol ){
              zFault = "foreign key";
            }
          }
        }
      }
#endif
      for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
        int j;
        for(j=0; j<pIdx->nKeyCol; j++){
          /* FIXME: Be smarter about indexes that use expressions */
          if( pIdx->aiColumn[j]==iCol || pIdx->aiColumn[j]==XN_EXPR ){
            zFault = "indexed";
          }
        }
      }
      if( zFault ){
        sqlite3DbFree(db, zErr);
        zErr = sqlite3MPrintf(db, "cannot open %s column for writing", zFault);
        rc = SQLITE_ERROR;
        sqlite3BtreeLeaveAll(db);
        goto blob_open_out;
      }
    }

    pBlob->pStmt = (sqlite3_stmt *)sqlite3VdbeCreate(pParse);
    assert( pBlob->pStmt || db->mallocFailed );
    if( pBlob->pStmt ){
      
      /* This VDBE program seeks a btree cursor to the identified 
      ** db/table/row entry. The reason for using a vdbe program instead
      ** of writing code to use the b-tree layer directly is that the
      ** vdbe program will take advantage of the various transaction,
      ** locking and error handling infrastructure built into the vdbe.
      **
      ** After seeking the cursor, the vdbe executes an OP_ResultRow.
      ** Code external to the Vdbe then "borrows" the b-tree cursor and
      ** uses it to implement the blob_read(), blob_write() and 
      ** blob_bytes() functions.
      **
      ** The sqlite3_blob_close() function finalizes the vdbe program,
      ** which closes the b-tree cursor and (possibly) commits the 
      ** transaction.
      */
      static const int iLn = VDBE_OFFSET_LINENO(2);
      static const VdbeOpList openBlob[] = {
        {OP_TableLock,      0, 0, 0},  /* 0: Acquire a read or write lock */
        {OP_OpenRead,       0, 0, 0},  /* 1: Open a cursor */
        /* blobSeekToRow() will initialize r[1] to the desired rowid */
        {OP_NotExists,      0, 5, 1},  /* 2: Seek the cursor to rowid=r[1] */
        {OP_Column,         0, 0, 1},  /* 3  */
        {OP_ResultRow,      1, 0, 0},  /* 4  */
        {OP_Halt,           0, 0, 0},  /* 5  */
      };
      Vdbe *v = (Vdbe *)pBlob->pStmt;
      int iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
      VdbeOp *aOp;

      sqlite3VdbeAddOp4Int(v, OP_Transaction, iDb, wrFlag, 
                           pTab->pSchema->schema_cookie,
                           pTab->pSchema->iGeneration);
      sqlite3VdbeChangeP5(v, 1);     
      aOp = sqlite3VdbeAddOpList(v, ArraySize(openBlob), openBlob, iLn);

      /* Make sure a mutex is held on the table to be accessed */
      sqlite3VdbeUsesBtree(v, iDb); 

      if( db->mallocFailed==0 ){
        assert( aOp!=0 );
        /* Configure the OP_TableLock instruction */
#ifdef SQLITE_OMIT_SHARED_CACHE
        aOp[0].opcode = OP_Noop;
#else
        aOp[0].p1 = iDb;
        aOp[0].p2 = pTab->tnum;
        aOp[0].p3 = wrFlag;
        sqlite3VdbeChangeP4(v, 1, pTab->zName, P4_TRANSIENT);
      }
      if( db->mallocFailed==0 ){
#endif

        /* Remove either the OP_OpenWrite or OpenRead. Set the P2 
        ** parameter of the other to pTab->tnum.  */
        if( wrFlag ) aOp[1].opcode = OP_OpenWrite;
        aOp[1].p2 = pTab->tnum;
        aOp[1].p3 = iDb;   

        /* Configure the number of columns. Configure the cursor to
        ** think that the table has one more column than it really
        ** does. An OP_Column to retrieve this imaginary column will
        ** always return an SQL NULL. This is useful because it means
        ** we can invoke OP_Column to fill in the vdbe cursors type 
        ** and offset cache without causing any IO.
        */
        aOp[1].p4type = P4_INT32;
        aOp[1].p4.i = pTab->nCol+1;
        aOp[3].p2 = pTab->nCol;

        pParse->nVar = 0;
        pParse->nMem = 1;
        pParse->nTab = 1;
        sqlite3VdbeMakeReady(v, pParse);
      }
    }
   
    pBlob->iCol = iCol;
    pBlob->db = db;
    sqlite3BtreeLeaveAll(db);
    if( db->mallocFailed ){
      goto blob_open_out;
    }
    rc = blobSeekToRow(pBlob, iRow, &zErr);
  } while( (++nAttempt)<SQLITE_MAX_SCHEMA_RETRY && rc==SQLITE_SCHEMA );

blob_open_out:
  if( rc==SQLITE_OK && db->mallocFailed==0 ){
    *ppBlob = (sqlite3_blob *)pBlob;
  }else{
    if( pBlob && pBlob->pStmt ) sqlite3VdbeFinalize((Vdbe *)pBlob->pStmt);
    sqlite3DbFree(db, pBlob);
  }
  sqlite3ErrorWithMsg(db, rc, (zErr ? "%s" : 0), zErr);
  sqlite3DbFree(db, zErr);
  sqlite3ParserReset(pParse);
  sqlite3StackFree(db, pParse);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}